

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O0

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::sphereTest
          (TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,float radius,
          bool allowHitSurface)

{
  tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *this_00;
  undefined1 auVar1 [16];
  float fVar2;
  byte in_DL;
  vec<3,_float,_(glm::qualifier)0> *in_RDI;
  double dVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM4 [16];
  float in_XMM6_Da;
  vec<3,_float,_(glm::qualifier)0> vVar13;
  float tHit_1;
  vec3 hitPoint;
  float tHit;
  float disc;
  float c;
  float b;
  vec3 oc;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  vec<3,_float,_(glm::qualifier)0> *v2;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe70;
  vec<3,float,(glm::qualifier)0> local_150 [12];
  float local_144;
  undefined4 local_140;
  float local_13c;
  undefined8 local_138;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_130;
  undefined8 local_128;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_120;
  float local_11c;
  undefined8 local_118;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_110;
  undefined8 local_108;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_100;
  undefined8 local_f8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_f0;
  undefined8 local_e8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_e0;
  vec<3,float,(glm::qualifier)0> local_dc [12];
  float local_d0;
  undefined4 local_cc;
  undefined8 local_c8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c0;
  undefined8 local_b4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  undefined8 local_98;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_90;
  undefined8 local_84;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_7c;
  byte local_75;
  float local_74;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  undefined1 extraout_var [60];
  
  auVar12 = in_ZMM0._8_56_;
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  local_48 = vmovlpd_avx(in_ZMM2._0_16_);
  local_68 = vmovlpd_avx(in_XMM4);
  local_75 = in_DL & 1;
  v2 = in_RDI;
  local_74 = in_XMM6_Da;
  local_58 = local_68;
  local_38 = local_48;
  local_18 = local_28;
  vVar13 = glm::operator-(in_stack_fffffffffffffe70,in_RDI);
  local_90 = vVar13.field_2;
  auVar4._0_8_ = vVar13._0_8_;
  auVar4._8_56_ = auVar12;
  local_98 = vmovlpd_avx(auVar4._0_16_);
  local_84 = local_98;
  local_7c = local_90;
  local_9c = glm::dot<3,float,(glm::qualifier)0>
                       (in_RDI,(vec<3,_float,_(glm::qualifier)0> *)
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_9c = local_9c * 2.0;
  auVar5._0_4_ = glm::dot<3,float,(glm::qualifier)0>
                           (in_RDI,(vec<3,_float,_(glm::qualifier)0> *)
                                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  auVar5._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_74),ZEXT416((uint)-local_74),auVar5._0_16_);
  local_a0 = auVar1._0_4_;
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_9c),ZEXT416((uint)local_9c),
                           ZEXT416((uint)-(local_a0 * 4.0)));
  local_a4 = auVar1._0_4_;
  auVar12 = ZEXT856(0);
  if ((local_a4 < 1e-06) || ((local_75 & 1) == 0)) {
    vVar13 = glm::operator-(in_stack_fffffffffffffe70,v2);
    local_c0 = vVar13.field_2;
    auVar6._0_8_ = vVar13._0_8_;
    auVar6._8_56_ = auVar12;
    local_c8 = vmovlpd_avx(auVar6._0_16_);
    local_b4 = local_c8;
    local_ac = local_c0;
    local_a8 = glm::dot<3,float,(glm::qualifier)0>
                         (in_RDI,(vec<3,_float,_(glm::qualifier)0> *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (0.0 <= local_a8) {
      auVar12 = (undefined1  [56])0x0;
      vVar13 = glm::operator*(SUB84(v2,0),in_RDI);
      local_100 = vVar13.field_2;
      auVar7._0_8_ = vVar13._0_8_;
      auVar7._8_56_ = auVar12;
      local_108 = vmovlpd_avx(auVar7._0_16_);
      local_f8 = local_108;
      local_f0 = local_100;
      vVar13 = glm::operator+(in_stack_fffffffffffffe70,v2);
      local_110 = vVar13.field_2;
      auVar8._0_8_ = vVar13._0_8_;
      auVar8._8_56_ = auVar12;
      local_118 = vmovlpd_avx(auVar8._0_16_);
      local_e8 = local_118;
      local_e0 = local_110;
      vVar13 = glm::operator-(in_stack_fffffffffffffe70,v2);
      local_130 = vVar13.field_2;
      auVar9._0_8_ = vVar13._0_8_;
      auVar9._8_56_ = auVar12;
      local_138 = vmovlpd_avx(auVar9._0_16_);
      local_128 = local_138;
      local_120 = local_130;
      local_11c = glm::length<3,float,(glm::qualifier)0>
                            ((vec<3,_float,_(glm::qualifier)0> *)0x45bd8f);
      local_11c = local_11c - local_74;
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<float_&,_float,_glm::vec<3,_float,_(glm::qualifier)0>_&,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 in_stack_fffffffffffffe70,(float *)v2,(float *)in_RDI,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
    else {
      local_cc = 0xffffffff;
      local_d0 = std::numeric_limits<float>::infinity();
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_dc,0.0,0.0,0.0);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<int,_float,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 in_stack_fffffffffffffe70,(int *)v2,(float *)in_RDI,
                 (vec<3,_float,_(glm::qualifier)0> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  else {
    fVar2 = -local_9c;
    dVar3 = std::sqrt((double)(ulong)(uint)local_a4);
    local_13c = (fVar2 - SUB84(dVar3,0)) / 2.0;
    if (0.0 <= local_13c) {
      auVar12 = (undefined1  [56])0x0;
      vVar13 = glm::operator*(SUB84(v2,0),in_RDI);
      auVar10._0_8_ = vVar13._0_8_;
      auVar10._8_56_ = auVar12;
      vmovlpd_avx(auVar10._0_16_);
      vVar13 = glm::operator+(in_stack_fffffffffffffe70,v2);
      auVar11._0_8_ = vVar13._0_8_;
      auVar11._8_56_ = auVar12;
      this_00 = (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                vmovlpd_avx(auVar11._0_16_);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<float_&,_int,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
                (this_00,(float *)v2,(int *)in_RDI,
                 (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(fVar2,in_stack_fffffffffffffe58));
    }
    else {
      local_140 = 0xffffffff;
      local_144 = std::numeric_limits<float>::infinity();
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>(local_150,0.0,0.0,0.0);
      std::tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>::
      tuple<int,_float,_glm::vec<3,_float,_(glm::qualifier)0>,_true,_true>
                ((tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)
                 in_stack_fffffffffffffe70,(int *)v2,(float *)in_RDI,
                 (vec<3,_float,_(glm::qualifier)0> *)CONCAT44(fVar2,in_stack_fffffffffffffe58));
    }
  }
  return (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *)v2;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::sphereTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                    glm::vec3 center, float radius,
                                                                    bool allowHitSurface) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 oc = raySource - center;
  float b = 2. * dot(oc, rayDir);
  float c = glm::dot(oc, oc) - radius * radius;
  float disc = b * b - 4 * c;
  if (disc < 1e-6 || !allowHitSurface) {
    // miss, return nearest point
    float tHit = glm::dot(rayDir, center - raySource);
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    glm::vec3 hitPoint = raySource + tHit * rayDir;
    return ret_t{tHit, glm::length(hitPoint - center) - radius, hitPoint};
  } else {
    // actual hit
    float tHit = (-b - std::sqrt(disc)) / 2.;
    if (tHit < 0.) {
      // hit behind
      return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}};
    }
    return ret_t{tHit, 0, raySource + tHit * rayDir};
  }
}